

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringFormat.h
# Opt level: O0

void doFormatString<unsigned_long_const,unsigned_char>
               (wstringstream *stream,wchar_t *format,unsigned_long *first,uchar *rest)

{
  unsigned_long uVar1;
  bool bVar2;
  uchar *rest_local;
  unsigned_long *first_local;
  wchar_t *format_local;
  wstringstream *stream_local;
  
  first_local = (unsigned_long *)format;
  format_local = (wchar_t *)stream;
  while( true ) {
    if ((int)*first_local == 0) {
      return;
    }
    if ((int)*first_local == 0x25) break;
    uVar1 = *first_local;
    first_local = (unsigned_long *)((long)first_local + 4);
    std::operator<<((wostream *)(format_local + 4),(wchar_t)uVar1);
  }
  first_local = (unsigned_long *)((long)first_local + 4);
  bVar2 = doFormatSetup((wstringstream *)format_local,(wchar_t **)&first_local);
  if (bVar2) {
    std::wostream::operator<<((wostream *)(format_local + 4),*first);
  }
  doFormatString<unsigned_char_const>((wstringstream *)format_local,(wchar_t *)first_local,rest);
  return;
}

Assistant:

void doFormatString(std::wstringstream& stream, const wchar_t* format, First& first, const Rest&... rest)
{
	while (*format != 0)
	{
		if (*format == '%')
		{
			format++;
			if (doFormatSetup(stream,format))
				stream << first;
			doFormatString(stream,format,rest...);
			return;
		}

		stream << *format++;
	}
}